

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
CheckEqualFailure::CheckEqualFailure
          (CheckEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          SimpleString *expected,SimpleString *actual,SimpleString *text)

{
  char cVar1;
  char cVar2;
  undefined1 local_a8 [24];
  size_t failStartPrintable;
  size_t failStart;
  undefined1 local_78 [8];
  SimpleString printableActual;
  SimpleString printableExpected;
  SimpleString *local_38;
  SimpleString *actual_local;
  SimpleString *expected_local;
  size_t lineNumber_local;
  char *fileName_local;
  UtestShell *test_local;
  CheckEqualFailure *this_local;
  
  local_38 = actual;
  actual_local = expected;
  expected_local = (SimpleString *)lineNumber;
  lineNumber_local = (size_t)fileName;
  fileName_local = (char *)test;
  test_local = (UtestShell *)this;
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__CheckEqualFailure_0042e818;
  TestFailure::createUserText((TestFailure *)&stack0xffffffffffffffb8,(SimpleString *)this);
  SimpleString::operator=
            (&(this->super_TestFailure).message_,(SimpleString *)&stack0xffffffffffffffb8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb8);
  SimpleString::asCharString(actual_local);
  PrintableStringFromOrNull((char *)&printableActual.bufferSize_);
  SimpleString::asCharString(local_38);
  PrintableStringFromOrNull(local_78);
  TestFailure::createButWasString
            ((TestFailure *)&failStart,(SimpleString *)this,
             (SimpleString *)&printableActual.bufferSize_);
  SimpleString::operator+=(&(this->super_TestFailure).message_,(SimpleString *)&failStart);
  SimpleString::~SimpleString((SimpleString *)&failStart);
  failStartPrintable = 0;
  while( true ) {
    cVar1 = SimpleString::at(local_38,failStartPrintable);
    cVar2 = SimpleString::at(actual_local,failStartPrintable);
    if (cVar1 != cVar2) break;
    failStartPrintable = failStartPrintable + 1;
  }
  local_a8._16_8_ = 0;
  while( true ) {
    cVar1 = SimpleString::at((SimpleString *)local_78,local_a8._16_8_);
    cVar2 = SimpleString::at((SimpleString *)&printableActual.bufferSize_,local_a8._16_8_);
    if (cVar1 != cVar2) break;
    local_a8._16_8_ = local_a8._16_8_ + 1;
  }
  TestFailure::createDifferenceAtPosString
            ((TestFailure *)local_a8,(SimpleString *)this,(size_t)local_78,local_a8._16_8_);
  SimpleString::operator+=(&(this->super_TestFailure).message_,(SimpleString *)local_a8);
  SimpleString::~SimpleString((SimpleString *)local_a8);
  SimpleString::~SimpleString((SimpleString *)local_78);
  SimpleString::~SimpleString((SimpleString *)&printableActual.bufferSize_);
  return;
}

Assistant:

CheckEqualFailure::CheckEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, const SimpleString& expected, const SimpleString& actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString printableExpected = PrintableStringFromOrNull(expected.asCharString());
    SimpleString printableActual = PrintableStringFromOrNull(actual.asCharString());

    message_ += createButWasString(printableExpected, printableActual);

    size_t failStart;
    for (failStart = 0; actual.at(failStart) == expected.at(failStart); failStart++)
        ;
    size_t failStartPrintable;
    for (failStartPrintable = 0; printableActual.at(failStartPrintable) == printableExpected.at(failStartPrintable); failStartPrintable++)
        ;
    message_ += createDifferenceAtPosString(printableActual, failStartPrintable, failStart);
}